

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportMemoryCounter(accum,"Memory/Film pixels",*(int64_t *)(in_FS_OFFSET + -8));
  *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  return;
}

Assistant:

ParsedScene::ParsedScene() {
    // Allocate _graphicsState_
    graphicsState = new GraphicsState;

    // Set scene defaults
    ParameterDictionary dict({}, RGBColorSpace::sRGB);
    materials.push_back(SceneEntity("diffuse", dict, {}));

    accelerator.name = "bvh";

    camera.name = "perspective";

    sampler.name = "pmj02bn";

    filter.name = "gaussian";

    film.name = "rgb";
    film.parameters = ParameterDictionary({}, RGBColorSpace::sRGB);

    integrator.name = "volpath";
}